

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<ProjectBuilderSources>::emplace<ProjectBuilderSources>
          (QGenericArrayOps<ProjectBuilderSources> *this,qsizetype i,ProjectBuilderSources *args)

{
  ProjectBuilderSources **ppPVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_c8;
  ProjectBuilderSources tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<ProjectBuilderSources>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<ProjectBuilderSources>).size == i) {
      qVar5 = QArrayDataPointer<ProjectBuilderSources>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<ProjectBuilderSources>);
      if (qVar5 == 0) goto LAB_001363a1;
      ProjectBuilderSources::ProjectBuilderSources
                ((this->super_QArrayDataPointer<ProjectBuilderSources>).ptr +
                 (this->super_QArrayDataPointer<ProjectBuilderSources>).size,args);
LAB_001364ba:
      pqVar2 = &(this->super_QArrayDataPointer<ProjectBuilderSources>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00136473;
    }
LAB_001363a1:
    if (i == 0) {
      qVar5 = QArrayDataPointer<ProjectBuilderSources>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<ProjectBuilderSources>);
      if (qVar5 != 0) {
        ProjectBuilderSources::ProjectBuilderSources
                  ((this->super_QArrayDataPointer<ProjectBuilderSources>).ptr + -1,args);
        ppPVar1 = &(this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
        *ppPVar1 = *ppPVar1 + -1;
        goto LAB_001364ba;
      }
    }
  }
  tmp.compiler.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  tmp.compiler.d.size = -0x5555555555555556;
  tmp.group.d.size = -0x5555555555555556;
  tmp.compiler.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.group.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.group.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  tmp.key.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  tmp.key.d.size = -0x5555555555555556;
  tmp.buildable = true;
  tmp.object_output = true;
  tmp._2_6_ = 0xaaaaaaaaaaaa;
  tmp.key.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  ProjectBuilderSources::ProjectBuilderSources(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<ProjectBuilderSources>).size != 0;
  QArrayDataPointer<ProjectBuilderSources>::detachAndGrow
            (&this->super_QArrayDataPointer<ProjectBuilderSources>,(uint)(i == 0 && bVar6),1,
             (ProjectBuilderSources **)0x0,(QArrayDataPointer<ProjectBuilderSources> *)0x0);
  if (i == 0 && bVar6) {
    ProjectBuilderSources::ProjectBuilderSources
              ((this->super_QArrayDataPointer<ProjectBuilderSources>).ptr + -1,&tmp);
    ppPVar1 = &(this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
    *ppPVar1 = *ppPVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<ProjectBuilderSources>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_c8.sourceCopyConstruct = 0;
    local_c8.nSource = 0;
    local_c8.move = 0;
    local_c8.sourceCopyAssign = 0;
    local_c8.end = (ProjectBuilderSources *)0x0;
    local_c8.last = (ProjectBuilderSources *)0x0;
    local_c8.where = (ProjectBuilderSources *)0x0;
    local_c8.begin = (this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
    local_c8.size = (this->super_QArrayDataPointer<ProjectBuilderSources>).size;
    local_c8.data = &this->super_QArrayDataPointer<ProjectBuilderSources>;
    Inserter::insertOne(&local_c8,i,&tmp);
    (local_c8.data)->ptr = local_c8.begin;
    (local_c8.data)->size = local_c8.size;
  }
  ProjectBuilderSources::~ProjectBuilderSources(&tmp);
LAB_00136473:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }